

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp_echo_server.cpp
# Opt level: O2

void UdpServerReadCallback(sz_sock sockfd,Timestamp receiveTime)

{
  sz_ssize_t sVar1;
  self *psVar2;
  SourceFile file;
  SourceFile file_00;
  SourceFile file_01;
  Logger local_1478;
  char local_4a8 [8];
  char message [1024];
  char addrStr [64];
  undefined4 local_60;
  undefined1 local_58 [12];
  undefined1 local_48 [12];
  undefined1 auStack_38 [8];
  sockaddr peerAddr;
  
  auStack_38._0_2_ = 0;
  auStack_38[2] = '\0';
  auStack_38[3] = '\0';
  auStack_38[4] = '\0';
  auStack_38[5] = '\0';
  auStack_38[6] = '\0';
  auStack_38[7] = '\0';
  peerAddr.sa_family = 0;
  peerAddr.sa_data[0] = '\0';
  peerAddr.sa_data[1] = '\0';
  peerAddr.sa_data[2] = '\0';
  peerAddr.sa_data[3] = '\0';
  peerAddr.sa_data[4] = '\0';
  peerAddr.sa_data[5] = '\0';
  sVar1 = sznet::net::sockets::sz_udp_recv(sockfd,local_4a8,0x400,(sockaddr *)auStack_38);
  if (sVar1 < 0) {
    sznet::Logger::SourceFile::SourceFile<115>
              ((SourceFile *)(addrStr + 0x38),
               (char (*) [115])
               "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/test/echo/udp_echo/udp_echo_server.cpp"
              );
    file_01._12_4_ = 0;
    file_01.m_data = (char *)addrStr._56_8_;
    file_01.m_size = local_60;
    sznet::Logger::Logger(&local_1478,file_01,0x2d,false);
    sznet::LogStream::operator<<(&local_1478.m_impl.m_stream,"sz_udp_recv");
  }
  else {
    sznet::net::sockets::sz_toipport(message + 0x3f8,0x40,(sockaddr *)auStack_38);
    local_4a8[sVar1] = '\0';
    if (sznet::g_logLevel < 3) {
      sznet::Logger::SourceFile::SourceFile<115>
                ((SourceFile *)local_58,
                 (char (*) [115])
                 "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/test/echo/udp_echo/udp_echo_server.cpp"
                );
      file._12_4_ = 0;
      file.m_data = (char *)local_58._0_8_;
      file.m_size = local_58._8_4_;
      sznet::Logger::Logger(&local_1478,file,0x34);
      psVar2 = sznet::LogStream::operator<<(&local_1478.m_impl.m_stream,"recv: ");
      psVar2 = sznet::LogStream::operator<<(psVar2,local_4a8);
      psVar2 = sznet::LogStream::operator<<(psVar2,", from: ");
      sznet::LogStream::operator<<(psVar2,message + 0x3f8);
      sznet::Logger::~Logger(&local_1478);
    }
    sznet::net::sockets::sz_udp_send(sockfd,local_4a8,(int)sVar1,(sockaddr *)auStack_38);
    if (2 < sznet::g_logLevel) {
      return;
    }
    sznet::Logger::SourceFile::SourceFile<115>
              ((SourceFile *)local_48,
               (char (*) [115])
               "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/test/echo/udp_echo/udp_echo_server.cpp"
              );
    file_00._12_4_ = 0;
    file_00.m_data = (char *)local_48._0_8_;
    file_00.m_size = local_48._8_4_;
    sznet::Logger::Logger(&local_1478,file_00,0x39);
    psVar2 = sznet::LogStream::operator<<(&local_1478.m_impl.m_stream,"echo send: ");
    psVar2 = sznet::LogStream::operator<<(psVar2,local_4a8);
    psVar2 = sznet::LogStream::operator<<(psVar2,", to: ");
    sznet::LogStream::operator<<(psVar2,message + 0x3f8);
  }
  sznet::Logger::~Logger(&local_1478);
  return;
}

Assistant:

void UdpServerReadCallback(sockets::sz_sock sockfd, sznet::Timestamp receiveTime)
{
    char message[1024];
    void* recvBuf = reinterpret_cast<void*>(&message);
    struct sockaddr peerAddr;
    memset(&peerAddr, 0, sizeof(peerAddr));
    
    sz_ssize_t nr = sockets::sz_udp_recv(sockfd, recvBuf, 1024, &peerAddr);
    if (nr < 0)
    {
        LOG_SYSERR << "sz_udp_recv";
        return;
    }

    char addrStr[64];
    sockets::sz_toipport(addrStr, sizeof(addrStr), &peerAddr);
    message[nr] = 0;
    LOG_INFO << "recv: " << message << ", from: " << addrStr;

    const void* sendBuf = const_cast<const void*>(recvBuf);
    int sendBufSize = static_cast<int>(nr);
    nr = sockets::sz_udp_send(sockfd, sendBuf, sendBufSize, &peerAddr);
    LOG_INFO << "echo send: " << message << ", to: " << addrStr;
}